

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

ssize_t zt_cstr_find(char *s,ssize_t i,ssize_t j,char *str)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  char *in_RCX;
  char *in_RDI;
  ssize_t t;
  size_t len_1;
  size_t len;
  size_t in_stack_ffffffffffffffb8;
  ssize_t in_stack_ffffffffffffffc0;
  long local_20;
  ssize_t local_18;
  
  sVar2 = strlen(in_RDI);
  if (sVar2 == 0) {
    local_18 = 0;
    local_20 = 0;
  }
  else {
    local_18 = IDX(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    sVar3 = IDX(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_20 = sVar3;
    if (sVar3 < local_18) {
      local_20 = local_18;
      local_18 = sVar3;
    }
  }
  sVar2 = strlen(in_RCX);
  if (sVar2 != 0) {
    if (sVar2 == 1) {
      for (; local_18 <= local_20; local_18 = local_18 + 1) {
        if (in_RDI[local_18] == *in_RCX) {
          return local_18;
        }
      }
    }
    for (; (long)(local_18 + sVar2) <= local_20 + 1; local_18 = local_18 + 1) {
      iVar1 = strncmp(in_RDI + local_18,in_RCX,sVar2);
      if (iVar1 == 0) {
        return local_18;
      }
    }
  }
  return -1;
}

Assistant:

ssize_t
zt_cstr_find(const char *s, ssize_t i, ssize_t j, const char *str) {
    size_t    len;

    CONVERT(s, i, j);
    zt_assert(str);

    len = strlen(str);

    if (len == 0) {
        return -1;
    } else if (len == 1) {
        for (; i <= j; i++) {
            if (s[i] == *str) {
                return i;
            }
        }
    }

    for (; (ssize_t)(i + len) <= (j + 1); i++) {
        if (strncmp(&s[i], str, len) == 0) {
            return i;
        }
    }

    return -1;
}